

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTest::createInstance
          (AdvGraphicsTest *this,Context *context)

{
  Context *context_00;
  AdvGraphicsTestInstance *this_00;
  vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_30;
  Context *local_18;
  Context *context_local;
  AdvGraphicsTest *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (AdvGraphicsTestInstance *)operator_new(0x5e8);
  context_00 = local_18;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&local_30,&(this->super_BasicGraphicsTest).super_TimestampTest.m_stages);
  AdvGraphicsTestInstance::AdvGraphicsTestInstance
            (this_00,context_00,&local_30,
             (bool)((this->super_BasicGraphicsTest).super_TimestampTest.m_inRenderPass & 1));
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::~vector
            (&local_30);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* AdvGraphicsTest::createInstance(Context& context) const
{
	return new AdvGraphicsTestInstance(context,m_stages,m_inRenderPass);
}